

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O1

permonst * muse_newcham_mon(monst *mon)

{
  short sVar1;
  obj *poVar2;
  permonst *ppVar3;
  
  poVar2 = which_armor(mon,1);
  if (poVar2 != (obj *)0x0) {
    sVar1 = poVar2->otyp;
    if ((ushort)(sVar1 - 0x5fU) < 0xb) {
      ppVar3 = mons + (long)sVar1 + 0x34;
    }
    else {
      if (10 < (ushort)(sVar1 - 0x54U)) goto LAB_001fc18c;
      ppVar3 = mons + (long)sVar1 + 0x3f;
    }
    return ppVar3;
  }
LAB_001fc18c:
  ppVar3 = rndmonst(mon->dlevel);
  return ppVar3;
}

Assistant:

static const struct permonst *muse_newcham_mon(struct monst *mon)
{
	struct obj *m_armr;

	if ((m_armr = which_armor(mon, W_ARM)) != 0) {
	    if (Is_dragon_scales(m_armr->otyp))
		return Dragon_scales_to_pm(m_armr);
	    else if (Is_dragon_mail(m_armr->otyp))
		return Dragon_mail_to_pm(m_armr);
	}
	return rndmonst(mon->dlevel);
}